

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ScatterAlongAxisLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_scatteralongaxis
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ScatterAlongAxisLayerParams *pSVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_scatteralongaxis(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_scatteralongaxis(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pSVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ScatterAlongAxisLayerParams>(arena);
    (this->layer_).scatteralongaxis_ = pSVar2;
  }
  return (ScatterAlongAxisLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ScatterAlongAxisLayerParams* NeuralNetworkLayer::_internal_mutable_scatteralongaxis() {
  if (!_internal_has_scatteralongaxis()) {
    clear_layer();
    set_has_scatteralongaxis();
    layer_.scatteralongaxis_ = CreateMaybeMessage< ::CoreML::Specification::ScatterAlongAxisLayerParams >(GetArenaForAllocation());
  }
  return layer_.scatteralongaxis_;
}